

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

int ext_loader_impl_discover(loader_impl impl,loader_handle handle,context ctx)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  loader_impl_function_cast function_cast;
  loader_impl_ext_handle_lib_type ext;
  iterator __end1;
  iterator __begin1;
  vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
  *__range1;
  loader_impl_ext_handle ext_handle;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  loader_impl_ext_handle_lib_type *in_stack_ffffffffffffff60;
  loader_impl_ext_handle_lib_type *local_48;
  __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
  local_38 [4];
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38[0]._M_current =
       (loader_impl_ext_handle_lib_type *)
       std::
       vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
       begin((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
  end((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_> *)
      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar2) {
      return 0;
    }
    __gnu_cxx::
    __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
    ::operator*(local_38);
    loader_impl_ext_handle_lib_type::loader_impl_ext_handle_lib_type
              (in_stack_ffffffffffffff60,
               (loader_impl_ext_handle_lib_type *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    uVar1 = local_10;
    in_stack_ffffffffffffff60 = local_48;
    uVar3 = loader_impl_handle_container_of(local_10,local_18);
    in_stack_ffffffffffffff5c = (*(code *)in_stack_ffffffffffffff60)(uVar1,uVar3);
    bVar2 = in_stack_ffffffffffffff5c != 0;
    if (bVar2) {
      local_4 = 1;
    }
    loader_impl_ext_handle_lib_type::~loader_impl_ext_handle_lib_type
              ((loader_impl_ext_handle_lib_type *)0x109bbf);
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
    ::operator++(local_38);
  }
  return local_4;
}

Assistant:

int ext_loader_impl_discover(loader_impl impl, loader_handle handle, context ctx)
{
	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	(void)ctx; /* We have opted by pass the handle instead of the context of the handle */

	for (auto ext : ext_handle->extensions)
	{
		loader_impl_function_cast function_cast;

		function_cast.ptr = ext.addr;

		if (function_cast.fn(impl, loader_impl_handle_container_of(impl, handle)) != 0)
		{
			return 1;
		}
	}

	return 0;
}